

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::grow
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this,size_t size)

{
  size_t sVar1;
  buffer<wchar_t> *pbVar2;
  pointer p;
  ulong in_RSI;
  buffer<wchar_t> *in_RDI;
  wchar_t *new_data;
  wchar_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  wchar_t *in_stack_ffffffffffffffa8;
  allocator_type *in_stack_ffffffffffffffb0;
  buffer<wchar_t> *this_00;
  buffer<wchar_t> *__last;
  wchar_t *__first;
  size_t local_20;
  
  sVar1 = internal::buffer<wchar_t>::capacity(in_RDI);
  local_20 = sVar1 + (sVar1 >> 1);
  if (local_20 < in_RSI) {
    local_20 = in_RSI;
  }
  pbVar2 = (buffer<wchar_t> *)internal::buffer<wchar_t>::data(in_RDI);
  p = std::allocator_traits<std::allocator<wchar_t>_>::allocate
                (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  this_00 = pbVar2;
  __last = pbVar2;
  sVar1 = internal::buffer<wchar_t>::size(in_RDI);
  __first = (wchar_t *)((long)&this_00->_vptr_buffer + sVar1 * 4);
  internal::make_checked<wchar_t>(p,local_20);
  std::uninitialized_copy<wchar_t*,wchar_t*>(__first,(wchar_t *)__last,(wchar_t *)this_00);
  internal::buffer<wchar_t>::set(in_RDI,p,local_20);
  if (pbVar2 != in_RDI + 1) {
    __gnu_cxx::new_allocator<wchar_t>::deallocate
              ((new_allocator<wchar_t> *)this_00,in_stack_ffffffffffffffa8,0x1f2fae);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(std::size_t size) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (size > 1000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  std::size_t old_capacity = this->capacity();
  std::size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data = std::allocator_traits<Allocator>::allocate(*this, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          internal::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) Allocator::deallocate(old_data, old_capacity);
}